

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O2

void __thiscall Fl_Menu_Item_Type::write_static(Fl_Menu_Item_Type *this)

{
  Fluid_Image *this_00;
  Fl_Type *pFVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar10;
  char *pcVar11;
  Fl_Menu_Item_Type *m;
  Fl_Type **ppFVar12;
  Fl_Widget_Type *o;
  char *pcVar13;
  Fl_Type *pFVar14;
  Fl_Type **ppFVar15;
  long lVar16;
  Fl_Type *pFVar17;
  int i_1;
  int i;
  char *local_40;
  int i_2;
  
  pcVar10 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
  if (((pcVar10 != (char *)0x0) && (iVar5 = is_name(pcVar10), iVar5 != 0)) &&
     (iVar5 = Fl_Type::user_defined
                        ((Fl_Type *)this,(this->super_Fl_Widget_Type).super_Fl_Type.callback_),
     iVar5 == 0)) {
    pcVar10 = (this->super_Fl_Widget_Type).super_Fl_Type.user_data_type_;
    pcVar7 = "void*";
    if (pcVar10 != (char *)0x0) {
      pcVar7 = pcVar10;
    }
    write_declare("extern void %s(Fl_Menu_*, %s);",
                  (this->super_Fl_Widget_Type).super_Fl_Type.callback_,pcVar7);
  }
  for (lVar16 = 0xf; lVar16 != 0x13; lVar16 = lVar16 + 1) {
    pcVar10 = (this->super_Fl_Widget_Type).extra_code_[lVar16 + -0xf];
    if ((pcVar10 != (char *)0x0) && (iVar5 = isdeclare(pcVar10), iVar5 != 0)) {
      write_declare("%s",(this->super_Fl_Widget_Type).extra_code_[lVar16 + -0xf]);
    }
  }
  pcVar10 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
  if ((pcVar10 != (char *)0x0) && (iVar5 = is_name(pcVar10), iVar5 == 0)) {
    pcVar10 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
    bVar3 = false;
    bVar2 = false;
LAB_0017f7f4:
    cVar4 = *pcVar10;
    if (cVar4 == 'o') {
      iVar5 = is_id(pcVar10[1]);
      if (iVar5 == 0) {
        bVar2 = true;
      }
      cVar4 = *pcVar10;
    }
    else if (cVar4 == '\0') goto LAB_0017f858;
    if ((cVar4 == 'v') && (iVar5 = is_id(pcVar10[1]), iVar5 == 0)) {
      bVar3 = true;
    }
    do {
      pcVar7 = pcVar10 + 1;
      pcVar10 = pcVar10 + 1;
      iVar5 = is_id(*pcVar7);
    } while (iVar5 != 0);
    while ((*pcVar10 != '\0' && (iVar5 = is_id(*pcVar10), iVar5 == 0))) {
      pcVar10 = pcVar10 + 1;
    }
    goto LAB_0017f7f4;
  }
  goto LAB_0017fa2b;
LAB_0017f858:
  pcVar7 = Fl_Type::callback_name((Fl_Type *)this);
  pcVar8 = Fl_Type::class_name((Fl_Type *)this,1);
  if (pcVar8 == (char *)0x0) {
    write_c("\nstatic void %s(Fl_Menu_*",pcVar7);
  }
  else {
    write_c("\nvoid %s::%s_i(Fl_Menu_*",pcVar8,pcVar7);
  }
  if (bVar2) {
    write_c(" o");
  }
  pcVar11 = (this->super_Fl_Widget_Type).super_Fl_Type.user_data_type_;
  pcVar13 = "void*";
  if (pcVar11 != (char *)0x0) {
    pcVar13 = pcVar11;
  }
  write_c(", %s",pcVar13);
  if (bVar3) {
    write_c(" v");
  }
  write_c(") {\n  %s",(this->super_Fl_Widget_Type).super_Fl_Type.callback_);
  if (pcVar10[-1] != ';') {
    pcVar10 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
    pcVar9 = strrchr(pcVar10,10);
    pcVar11 = pcVar9 + 1;
    if (pcVar9 == (char *)0x0) {
      pcVar11 = pcVar10;
    }
    if ((*pcVar11 != '\0') && (*pcVar11 != '#')) {
      write_c(";");
    }
  }
  write_c("\n}\n");
  if (pcVar8 == (char *)0x0) goto LAB_0017fa2b;
  write_c("void %s::%s(Fl_Menu_* o, %s v) {\n",pcVar8,pcVar7,pcVar13);
  write_c("  ((%s*)(o",pcVar8);
  pFVar17 = (Fl_Type *)this;
  do {
    pFVar17 = pFVar17->parent;
    iVar5 = (*pFVar17->_vptr_Fl_Type[0x1e])(pFVar17);
  } while (iVar5 != 0);
  iVar5 = (*pFVar17->_vptr_Fl_Type[5])(pFVar17);
  iVar5 = strcmp((char *)CONCAT44(extraout_var,iVar5),"Fl_Input_Choice");
  pFVar14 = (Fl_Type *)0x0;
  pFVar1 = (Fl_Type *)0x0;
  if (iVar5 != 0) goto LAB_0017f9be;
  do {
    pFVar14 = pFVar1;
    write_c("->parent()");
LAB_0017f9be:
    pFVar17 = pFVar17->parent;
  } while (((pFVar17 != (Fl_Type *)0x0) &&
           (iVar5 = (*pFVar17->_vptr_Fl_Type[0x17])(pFVar17), iVar5 != 0)) &&
          (iVar5 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x26])(this),
          pFVar1 = pFVar17, iVar5 == 0));
  if (pFVar14 == (Fl_Type *)0x0) {
LAB_0017fa0c:
    write_c("->user_data()");
  }
  else {
    iVar5 = (*pFVar14->_vptr_Fl_Type[5])(pFVar14);
    iVar5 = strcmp((char *)CONCAT44(extraout_var_00,iVar5),"widget_class");
    if (iVar5 != 0) goto LAB_0017fa0c;
  }
  write_c("))->%s_i(o,v);\n}\n",pcVar7);
LAB_0017fa2b:
  this_00 = (this->super_Fl_Widget_Type).image;
  if ((this_00 != (Fluid_Image *)0x0) && (this_00->written != write_number)) {
    Fluid_Image::write_static(this_00);
    ((this->super_Fl_Widget_Type).image)->written = write_number;
  }
  pFVar17 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
  if ((pFVar17 == (Fl_Type *)0x0) || (iVar5 = (*pFVar17->_vptr_Fl_Type[0x1e])(), iVar5 == 0)) {
    pcVar10 = Fl_Type::class_name((Fl_Type *)this,1);
    if (pcVar10 == (char *)0x0) {
      if (i18n_type != 0) {
        pcVar7 = menu_name(this,&i_1);
        write_c("\nunsigned char %s_i18n_done = 0;",pcVar7);
      }
      pcVar7 = menu_name(this,&i_1);
      write_c("\nFl_Menu_Item %s[] = {\n",pcVar7);
    }
    else {
      if (i18n_type != 0) {
        pcVar7 = menu_name(this,&i);
        write_c("\nunsigned char %s::%s_i18n_done = 0;",pcVar10,pcVar7);
      }
      pcVar7 = menu_name(this,&i);
      write_c("\nFl_Menu_Item %s::%s[] = {\n",pcVar10,pcVar7);
    }
    ppFVar12 = &(this->super_Fl_Widget_Type).super_Fl_Type.prev;
    ppFVar15 = ppFVar12;
    while ((pFVar17 = *ppFVar15, pFVar17 != (Fl_Type *)0x0 &&
           (iVar5 = (*pFVar17->_vptr_Fl_Type[0x1e])(pFVar17), iVar5 != 0))) {
      ppFVar15 = &pFVar17->prev;
    }
    ppFVar15 = &pFVar17->next;
    local_40 = pcVar10;
    while ((pFVar1 = *ppFVar15, pFVar1 != (Fl_Type *)0x0 &&
           (iVar5 = (*(((Fl_Widget_Type *)&pFVar1->_vptr_Fl_Type)->super_Fl_Type)._vptr_Fl_Type
                      [0x1e])(pFVar1), iVar5 != 0))) {
      write_item((Fl_Menu_Item_Type *)pFVar1);
      iVar5 = pFVar1->level;
      iVar6 = (*(((Fl_Widget_Type *)&pFVar1->_vptr_Fl_Type)->super_Fl_Type)._vptr_Fl_Type[0x16])
                        (pFVar1);
      iVar5 = (iVar5 + 1) - (uint)(iVar6 == 0);
      ppFVar15 = &pFVar1->next;
      if ((pFVar1->next == (Fl_Type *)0x0) ||
         (iVar6 = (*pFVar1->next->_vptr_Fl_Type[0x1e])(), iVar6 == 0)) {
        iVar6 = pFVar17->level + 1;
      }
      else {
        iVar6 = (*ppFVar15)->level;
      }
      for (; iVar6 < iVar5; iVar5 = iVar5 + -1) {
        write_c(" {0,0,0,0,0,0,0,0,0},\n");
      }
    }
    write_c(" {0,0,0,0,0,0,0,0,0}\n};\n");
    pcVar10 = local_40;
    if (local_40 != (char *)0x0) {
      while ((o = (Fl_Widget_Type *)*ppFVar12, o != (Fl_Widget_Type *)0x0 &&
             (iVar5 = (*(o->super_Fl_Type)._vptr_Fl_Type[0x1e])(o), iVar5 != 0))) {
        ppFVar12 = &(o->super_Fl_Type).prev;
      }
      while ((o = (Fl_Widget_Type *)(o->super_Fl_Type).next, o != (Fl_Widget_Type *)0x0 &&
             (iVar5 = (*(o->super_Fl_Type)._vptr_Fl_Type[0x1e])(o), iVar5 != 0))) {
        pcVar7 = array_name(o);
        if (pcVar7 != (char *)0x0) {
          if (pcVar7 == (o->super_Fl_Type).name_) {
            pcVar8 = menu_name((Fl_Menu_Item_Type *)o,&i_2);
            write_c("Fl_Menu_Item* %s::%s = %s::%s + %d;\n",pcVar10,pcVar7,pcVar10,pcVar8,
                    (ulong)(uint)i_2);
          }
          else {
            write_c("Fl_Menu_Item* %s::%s;\n",pcVar10,pcVar7);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Menu_Item_Type::write_static() {
  if (callback() && is_name(callback()) && !user_defined(callback()))
    write_declare("extern void %s(Fl_Menu_*, %s);", callback(),
                  user_data_type() ? user_data_type() : "void*");
  for (int n=0; n < NUM_EXTRA_CODE; n++) {
    if (extra_code(n) && isdeclare(extra_code(n)))
      write_declare("%s", extra_code(n));
  }
  if (callback() && !is_name(callback())) {
    // see if 'o' or 'v' used, to prevent unused argument warnings:
    int use_o = 0;
    int use_v = 0;
    const char *d;
    for (d = callback(); *d;) {
      if (*d == 'o' && !is_id(d[1])) use_o = 1;
      if (*d == 'v' && !is_id(d[1])) use_v = 1;
      do d++; while (is_id(*d));
      while (*d && !is_id(*d)) d++;
    }
    const char* cn = callback_name();
    const char* k = class_name(1);
    if (k) {
      write_c("\nvoid %s::%s_i(Fl_Menu_*", k, cn);
    } else {
      write_c("\nstatic void %s(Fl_Menu_*", cn);
    }
    if (use_o) write_c(" o");
    const char* ut = user_data_type() ? user_data_type() : "void*";
    write_c(", %s", ut);
    if (use_v) write_c(" v");
    write_c(") {\n  %s", callback());
    if (*(d-1) != ';') {
      const char *p = strrchr(callback(), '\n');
      if (p) p ++;
      else p = callback();
      // Only add trailing semicolon if the last line is not a preprocessor
      // statement...
      if (*p != '#' && *p) write_c(";");
    }
    write_c("\n}\n");
    if (k) {
      write_c("void %s::%s(Fl_Menu_* o, %s v) {\n", k, cn, ut);
      write_c("  ((%s*)(o", k);
      Fl_Type* t = parent; while (t->is_menu_item()) t = t->parent;
      Fl_Type *q = 0;
      // Go up one more level for Fl_Input_Choice, as these are groups themselves
      if (t && !strcmp(t->type_name(), "Fl_Input_Choice"))
        write_c("->parent()");
      for (t = t->parent; t && t->is_widget() && !is_class(); q = t, t = t->parent) 
        write_c("->parent()");
      if (!q || strcmp(q->type_name(), "widget_class"))
        write_c("->user_data()");
      write_c("))->%s_i(o,v);\n}\n", cn);
    }
  }
  if (image) {
    if (image->written != write_number) {
      image->write_static();
      image->written = write_number;
    }
  }
  if (next && next->is_menu_item()) return;
  // okay, when we hit last item in the menu we have to write the
  // entire array out:
  const char* k = class_name(1);
  if (k) {
    int i; 
    if (i18n_type) write_c("\nunsigned char %s::%s_i18n_done = 0;", k, menu_name(i));
    write_c("\nFl_Menu_Item %s::%s[] = {\n", k, menu_name(i));
  } else {
    int i; 
    if (i18n_type) write_c("\nunsigned char %s_i18n_done = 0;", menu_name(i));
    write_c("\nFl_Menu_Item %s[] = {\n", menu_name(i));
  }
  Fl_Type* t = prev; while (t && t->is_menu_item()) t = t->prev;
  for (Fl_Type* q = t->next; q && q->is_menu_item(); q = q->next) {
    ((Fl_Menu_Item_Type*)q)->write_item();
    int thislevel = q->level; if (q->is_parent()) thislevel++;
    int nextlevel =
      (q->next && q->next->is_menu_item()) ? q->next->level : t->level+1;
    while (thislevel > nextlevel) {write_c(" {0,0,0,0,0,0,0,0,0},\n"); thislevel--;}
  }
  write_c(" {0,0,0,0,0,0,0,0,0}\n};\n");

  if (k) {
    // Write menu item variables...
    t = prev; while (t && t->is_menu_item()) t = t->prev;
    for (Fl_Type* q = t->next; q && q->is_menu_item(); q = q->next) {
      Fl_Menu_Item_Type *m = (Fl_Menu_Item_Type*)q;
      const char *c = array_name(m);
      if (c) {
        if (c==m->name()) {
          // assign a menu item address directly to a variable
          int i; 
          const char* n = ((Fl_Menu_Item_Type *)q)->menu_name(i);
          write_c("Fl_Menu_Item* %s::%s = %s::%s + %d;\n", k, c, k, n, i);
        } else {
          // if the name is an array, only define the array. 
          // The actual assignment is in write_code1()
          write_c("Fl_Menu_Item* %s::%s;\n", k, c);
        }
      }
    }
  }
}